

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O3

void __thiscall BGParseManager::~BGParseManager(BGParseManager *this)

{
  BGParseWorkItem *pBVar1;
  code *pcVar2;
  bool bVar3;
  JobProcessor *pJVar4;
  undefined4 *puVar5;
  Type element;
  
  pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
  (*pJVar4->_vptr_JobProcessor[1])(pJVar4,this);
  if ((this->workitemsProcessing).head != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                       ,0x51,"(this->workitemsProcessing.IsEmpty())",
                       "this->workitemsProcessing.IsEmpty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  element = (this->workitemsProcessed).head;
  while (element != (BGParseWorkItem *)0x0) {
    pBVar1 = (BGParseWorkItem *)
             (element->super_Job).super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>
             .next;
    JsUtil::DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::
    UnlinkPartial<BGParseWorkItem>
              (element,&(this->workitemsProcessed).head,&(this->workitemsProcessed).tail);
    (element->super_Job).super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous
         = (Type)0x0;
    (element->super_Job).super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.next =
         (Type)0x0;
    BGParseWorkItem::~BGParseWorkItem(element);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,element,0xd0);
    element = pBVar1;
  }
  (this->super_WaitableJobManager).super_JobManager._vptr_JobManager =
       (_func_int **)&PTR_JobProcessing_014d7ef8;
  CloseHandle((this->super_WaitableJobManager).queuedJobsProcessed.handle);
  CloseHandle((this->super_WaitableJobManager).jobBeingWaitedUponProcessed.handle);
  return;
}

Assistant:

BGParseManager::~BGParseManager()
{
    // First, remove the manager from the JobProcessor so that any remaining jobs
    // are moved back into this manager's processed workitem list
    Processor()->RemoveManager(this);

    Assert(this->workitemsProcessing.IsEmpty());

    // Now, free all remaining processed jobs
    BGParseWorkItem *item = (BGParseWorkItem*)this->workitemsProcessed.Head();
    while (item != nullptr)
    {
        // Get the next item first so that the current item
        // can be safely removed and freed
        BGParseWorkItem* temp = item;
        item = (BGParseWorkItem*)item->Next();

        this->workitemsProcessed.Unlink(temp);
        HeapDelete(temp);
    }
}